

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintFastq(ConvertToolPrivate *this,BamAlignment *a)

{
  bool bVar1;
  ostream *poVar2;
  string sequence;
  string qualities;
  string name;
  
  std::__cxx11::string::string((string *)&name,(string *)a);
  bVar1 = BamAlignment::IsPaired(a);
  if (bVar1) {
    BamAlignment::IsFirstMate(a);
    std::__cxx11::string::append((char *)&name);
  }
  std::__cxx11::string::string((string *)&qualities,(string *)&a->Qualities);
  std::__cxx11::string::string((string *)&sequence,(string *)&a->QueryBases);
  bVar1 = BamAlignment::IsReverseStrand(a);
  if (bVar1) {
    Utilities::Reverse(&qualities);
    Utilities::ReverseComplement(&sequence);
  }
  poVar2 = std::operator<<(&this->m_out,'@');
  poVar2 = std::operator<<(poVar2,(string *)&name);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&sequence);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,'+');
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,(string *)&qualities);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&sequence);
  std::__cxx11::string::~string((string *)&qualities);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintFastq(const BamAlignment& a)
{

    // @BamAlignment.Name
    // BamAlignment.QueryBases
    // +
    // BamAlignment.Qualities
    //
    // N.B. - QueryBases are reverse-complemented (& Qualities reversed) if aligned to reverse strand .
    //        Name is appended "/1" or "/2" if paired-end, to reflect which mate this entry is.

    // handle paired-end alignments
    std::string name = a.Name;
    if (a.IsPaired()) name.append((a.IsFirstMate() ? "/1" : "/2"));

    // handle reverse strand alignment - bases & qualities
    std::string qualities = a.Qualities;
    std::string sequence = a.QueryBases;
    if (a.IsReverseStrand()) {
        Utilities::Reverse(qualities);
        Utilities::ReverseComplement(sequence);
    }

    // write to output stream
    m_out << '@' << name << std::endl
          << sequence << std::endl
          << '+' << std::endl
          << qualities << std::endl;
}